

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O0

Vec_Wrd_t * Abc_SuppGenPairs2(int nOnes,int nBits)

{
  int iVar1;
  Vec_Wrd_t *p;
  int Value;
  int Size;
  int k;
  int i;
  Vec_Wrd_t *vRes;
  int nBits_local;
  int nOnes_local;
  
  p = Vec_WrdAlloc(1000);
  for (Size = 0; Size < 1 << ((byte)nBits & 0x1f); Size = Size + 1) {
    iVar1 = Abc_SuppCountOnes(Size);
    for (Value = 1; (Value <= nOnes && (iVar1 != Value * 2)); Value = Value + 1) {
    }
    if (Value <= nOnes) {
      Vec_WrdPush(p,(long)Size);
    }
  }
  return p;
}

Assistant:

Vec_Wrd_t * Abc_SuppGenPairs2( int nOnes, int nBits )
{
    Vec_Wrd_t * vRes = Vec_WrdAlloc( 1000 );
    int i, k, Size = (1 << nBits), Value;
    for ( i = 0; i < Size; i++ )
    {
        Value = Abc_SuppCountOnes(i);
        for ( k = 1; k <= nOnes; k++ )
            if ( Value == 2*k )
                break;
        if ( k <= nOnes )
            Vec_WrdPush( vRes, i );
    }
    return vRes;
}